

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# messagepattern.cpp
# Opt level: O0

UBool __thiscall icu_63::MessagePattern::Part::operator==(Part *this,Part *other)

{
  bool local_29;
  Part *other_local;
  Part *this_local;
  
  if (this == other) {
    this_local._7_1_ = true;
  }
  else {
    local_29 = false;
    if ((((this->type == other->type) && (local_29 = false, this->index == other->index)) &&
        (local_29 = false, this->length == other->length)) &&
       (local_29 = false, this->value == other->value)) {
      local_29 = this->limitPartIndex == other->limitPartIndex;
    }
    this_local._7_1_ = local_29;
  }
  return this_local._7_1_;
}

Assistant:

UBool
MessagePattern::Part::operator==(const Part &other) const {
    if(this==&other) {
        return TRUE;
    }
    return
        type==other.type &&
        index==other.index &&
        length==other.length &&
        value==other.value &&
        limitPartIndex==other.limitPartIndex;
}